

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O2

string * __thiscall
cli::getPrettyVersion_abi_cxx11_(string *__return_storage_ptr__,cli *this,Version version)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 0) {
    __s = "1.0";
    __a = &local_9;
  }
  else {
    __s = "Unknown";
    __a = &local_a;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettyVersion(ZAP::Version version)
	{
		switch (version)
		{
		case ZAP::Version::V1_0: return "1.0";
		default: return "Unknown";
		}
	}